

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountPtr.h
# Opt level: O2

RefCountPtr<PDFBoolean> * __thiscall
RefCountPtr<PDFBoolean>::operator=(RefCountPtr<PDFBoolean> *this,PDFBoolean *inValue)

{
  if (this->mValue != (PDFBoolean *)0x0) {
    RefCountObject::Release((RefCountObject *)this->mValue);
  }
  this->mValue = inValue;
  if (inValue != (PDFBoolean *)0x0) {
    RefCountObject::AddRef((RefCountObject *)inValue);
  }
  return this;
}

Assistant:

RefCountPtr<T>&  RefCountPtr<T>::operator =(T* inValue)
{
	if(mValue)
		mValue->Release();
	mValue = inValue;
	if(mValue)
		mValue->AddRef();
	return *this;
}